

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_scalar_order(secp256k1_scalar *num)

{
  int overflow;
  uchar b32 [32];
  uint in_stack_ffffffffffffffd0;
  int iVar1;
  uchar *in_stack_ffffffffffffffd8;
  secp256k1_scalar *in_stack_ffffffffffffffe0;
  
  do {
    do {
      iVar1 = 0;
      testrand256((uchar *)(ulong)in_stack_ffffffffffffffd0);
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (int *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    } while (iVar1 != 0);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10ce50);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void testutil_random_scalar_order(secp256k1_scalar *num) {
    do {
        unsigned char b32[32];
        int overflow = 0;
        testrand256(b32);
        secp256k1_scalar_set_b32(num, b32, &overflow);
        if (overflow || secp256k1_scalar_is_zero(num)) {
            continue;
        }
        break;
    } while(1);
}